

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,IStream *is,int numThreads)

{
  bool bVar1;
  byte bVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  long *in_RSI;
  GenericInputFile *in_RDI;
  stringstream _iex_replace_s_1;
  BaseExc *e_1;
  stringstream _iex_replace_s;
  IStream *in_stack_00000238;
  Header *in_stack_00000240;
  Header *in_stack_00000278;
  DeepScanLineInputFile *in_stack_00000280;
  BaseExc *e;
  undefined1 in_stack_000018ae;
  undefined1 in_stack_000018af;
  Header *in_stack_000018b0;
  InputStreamMutex *in_stack_fffffffffffffc20;
  IStream *in_stack_fffffffffffffc38;
  DeepScanLineInputFile *in_stack_fffffffffffffc40;
  LineOrder in_stack_fffffffffffffc4c;
  IStream *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffcbc;
  Data *in_stack_fffffffffffffcc0;
  int *in_stack_ffffffffffffff80;
  IStream *in_stack_ffffffffffffff88;
  GenericInputFile *in_stack_ffffffffffffff90;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepScanLineInputFile_004c03c0;
  pp_Var3 = (_func_int **)operator_new(0x208);
  Data::Data(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
  in_RDI[1]._vptr_GenericInputFile = pp_Var3;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x40) = 0;
  in_RDI[1]._vptr_GenericInputFile[0x3f] = (_func_int *)0x0;
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  }
  else {
    p_Var4 = (_func_int *)operator_new(0x38);
    *(undefined8 *)(p_Var4 + 0x20) = 0;
    *(undefined8 *)(p_Var4 + 0x28) = 0;
    *(undefined8 *)(p_Var4 + 0x10) = 0;
    *(undefined8 *)(p_Var4 + 0x18) = 0;
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)(p_Var4 + 8) = 0;
    *(undefined8 *)(p_Var4 + 0x30) = 0;
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffc20);
    in_RDI[1]._vptr_GenericInputFile[0x3f] = p_Var4;
    *(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) = in_RSI;
    bVar2 = (**(code **)(*in_RSI + 0x10))();
    *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x30) = bVar2 & 1;
    Header::readFrom(in_stack_00000240,in_stack_00000238,__iex_replace_s);
    isTiled(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
    Header::sanityCheck(in_stack_000018b0,(bool)in_stack_000018af,(bool)in_stack_000018ae);
    initialize(in_stack_00000280,in_stack_00000278);
    anon_unknown_0::readLineOffsets
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc40,
               (bool *)in_stack_fffffffffffffc38);
  }
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : _data (new Data (numThreads))
{
    _data->_deleteStream = false;
    _data->_streamData   = nullptr;

    try
    {
        readMagicNumberAndVersionField (is, _data->version);
        //
        // Backward compatibility to read multpart file.
        // multiPartInitialize will create _streamData
        if (isMultiPart (_data->version))
        {
            compatibilityInitialize (is);
            return;
        }
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot read image file "
            "\"" << is.fileName ()
                 << "\". " << e.what ());
        throw;
    }

    //
    // not multiPart - allocate stream data and initialise as normal
    //
    try
    {
        _data->_streamData     = new InputStreamMutex ();
        _data->_streamData->is = &is;
        _data->memoryMapped    = is.isMemoryMapped ();
        _data->header.readFrom (*_data->_streamData->is, _data->version);
        _data->header.sanityCheck (isTiled (_data->version));

        initialize (_data->header);

        readLineOffsets (
            *_data->_streamData->is,
            _data->lineOrder,
            _data->lineOffsets,
            _data->fileIsComplete);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data && _data->_streamData) { delete _data->_streamData; }
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot read image file "
            "\"" << is.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data && _data->_streamData) { delete _data->_streamData; }
        if (_data) delete _data;

        throw;
    }
}